

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O1

void __thiscall wasm::LocalCSE::doWalkFunction(LocalCSE *this,Function *func)

{
  size_t *psVar1;
  Module *pMVar2;
  Expression **ppEVar3;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *p_Var4;
  undefined8 uVar5;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *this_00;
  undefined1 uVar6;
  undefined7 uVar7;
  __buckets_ptr pp_Var8;
  size_type sVar9;
  long lVar10;
  size_t *__s;
  undefined8 *puVar11;
  char *pcVar12;
  PassOptions *pPVar13;
  undefined8 *puVar14;
  pointer pTVar15;
  code *__n;
  pointer pTVar16;
  pointer pTVar17;
  undefined8 *puVar18;
  undefined1 *puStack_500;
  undefined1 auStack_4f8 [8];
  Scanner scanner;
  Checker checker;
  Applier applier;
  size_t *local_78;
  RequestInfoMap requestInfos;
  new_allocator<std::__detail::_Hash_node_base_*> local_31 [8];
  __buckets_alloc_type __alloc;
  
  pPVar13 = &((this->
              super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
              ).super_Pass.runner)->options;
  local_78 = &requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_rehash_policy._M_next_resize;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x1;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_bucket_count = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_element_count._0_4_ = 0x3f800000;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._4_4_ = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_4f8 = (undefined1  [8])0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .replacep = (Expression **)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currModule._0_1_ = 0;
  scanner.options = (PassOptions *)&local_78;
  scanner.requestInfos = (RequestInfoMap *)&scanner.activeExprs._M_h._M_rehash_policy._M_next_resize
  ;
  scanner.activeExprs._M_h._M_buckets = (__buckets_ptr)0x1;
  scanner.activeExprs._M_h._M_bucket_count = 0;
  scanner.activeExprs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scanner.activeExprs._M_h._M_element_count._0_4_ = 0x3f800000;
  scanner.activeExprs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  scanner.activeExprs._M_h._M_rehash_policy._4_4_ = 0;
  scanner.activeExprs._M_h._M_rehash_policy._M_next_resize = 0;
  scanner.activeExprs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar10 = 0x138;
  do {
    *(undefined8 *)((long)&puStack_500 + lVar10) = 0;
    *(undefined1 *)
     ((long)(scanner.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .stack.fixed._M_elems + -2) + 8 + lVar10) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x1d8);
  scanner.activeIncrementalInfo.fixed._M_elems[9].second = false;
  scanner.activeIncrementalInfo.fixed._M_elems[9]._9_7_ = 0;
  scanner.activeIncrementalInfo.flexible.
  super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.activeIncrementalInfo.flexible.
  super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.activeIncrementalInfo.flexible.
  super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  pMVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
           ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
           super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._0_1_ = SUB81(pMVar2,0);
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._1_7_ = (undefined7)((ulong)pMVar2 >> 8);
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = SUB81(func,0);
  uVar6 = scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)((ulong)func >> 8);
  uVar7 = scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)&func->body;
  puStack_500 = (undefined1 *)0x942fe4;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  ._216_8_ = pPVar13;
  Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              *)auStack_4f8,
             LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             ::scan,(Expression **)
                    requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_single_bucket);
  if (((long)scanner.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)scanner.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)scanner.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .replacep != 0) {
    do {
      if ((pointer)scanner.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (scanner.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .replacep == (Expression **)0x0) {
          pcVar12 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, N = 10]"
          ;
          goto LAB_00943775;
        }
        pTVar15 = (pointer)&scanner.
                            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                            .stack.fixed._M_elems
                            [(long)scanner.
                                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                                   .
                                   super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                                   .
                                   super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                                   .replacep + -2].currp;
      }
      else {
        pTVar15 = scanner.
                  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .stack.flexible.
                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      ppEVar3 = pTVar15->currp;
      if ((pointer)scanner.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (scanner.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .replacep == (Expression **)0x0) {
          pcVar12 = 
          "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, N = 10]"
          ;
          goto LAB_00943756;
        }
        scanner.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .replacep = (Expression **)
                    ((long)scanner.
                           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .replacep + -1);
      }
      else {
        scanner.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             scanner.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_4f8 = (undefined1  [8])ppEVar3;
      if (*ppEVar3 == (Expression *)0x0) {
        pcVar12 = 
        "void wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Scanner, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>]"
        ;
        goto LAB_009436db;
      }
      puStack_500 = (undefined1 *)0x943087;
      (*pTVar15->func)((Scanner *)auStack_4f8,ppEVar3);
    } while (((long)scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
             (long)scanner.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .replacep != 0);
  }
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._1_7_ = 0;
  if (requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    psVar1 = &checker.activeOriginals._M_h._M_rehash_policy._M_next_resize;
    scanner.connectAdjacentBlocks = false;
    scanner._489_7_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .replacep = (Expression **)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currModule._0_1_ = 0;
    checker.options = (PassOptions *)&local_78;
    checker.activeOriginals._M_h._M_buckets = (__buckets_ptr)0x1;
    checker.activeOriginals._M_h._M_bucket_count = 0;
    checker.activeOriginals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    checker.activeOriginals._M_h._M_element_count._0_4_ = 0x3f800000;
    checker.activeOriginals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    checker.activeOriginals._M_h._M_rehash_policy._4_4_ = 0;
    checker.activeOriginals._M_h._M_rehash_policy._M_next_resize = 0;
    checker.activeOriginals._M_h._M_single_bucket._0_1_ = 1;
    pMVar2 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
             ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
             super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._0_1_ = SUB81(pMVar2,0);
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._1_7_ = (undefined7)((ulong)pMVar2 >> 8);
    __n = LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          ::scan;
    puStack_500 = (undefined1 *)0x94315e;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar6;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uVar7;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    ._216_8_ = pPVar13;
    checker.requestInfos = (RequestInfoMap *)psVar1;
    Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                *)&scanner.connectAdjacentBlocks,
               LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               ::scan,(Expression **)
                      requestInfos.
                      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                      ._M_h._M_single_bucket);
    if (((long)checker.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)checker.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .stack.fixed._M_elems[9].currp >> 4) +
        (long)checker.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .replacep != 0) {
      do {
        if ((pointer)checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .stack.fixed._M_elems[9].currp ==
            checker.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (checker.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .replacep == (Expression **)0x0) {
            pcVar12 = 
            "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, N = 10]"
            ;
            goto LAB_00943775;
          }
          pTVar16 = (pointer)((long)(&checker.
                                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                      .
                                      super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                      .
                                      super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                      .stack + -1) + 0xb0 +
                             (long)checker.
                                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                   .
                                   super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                   .
                                   super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                   .replacep * 0x10);
        }
        else {
          pTVar16 = checker.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        __n = (code *)pTVar16->currp;
        if ((pointer)checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .stack.fixed._M_elems[9].currp ==
            checker.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (checker.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .replacep == (Expression **)0x0) {
            pcVar12 = 
            "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, N = 10]"
            ;
            goto LAB_00943756;
          }
          checker.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .replacep = (Expression **)
                      ((long)checker.
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                             .replacep + -1);
        }
        else {
          checker.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               checker.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        scanner._488_8_ = __n;
        if ((Expression *)(((__node_ptr)__n)->super__Hash_node_base)._M_nxt == (Expression *)0x0) {
          pcVar12 = 
          "void wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Checker, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>]"
          ;
          goto LAB_009436db;
        }
        puStack_500 = (undefined1 *)0x943201;
        (*pTVar16->func)((Checker *)&scanner.connectAdjacentBlocks,(Expression **)__n);
      } while (((long)checker.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)checker.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .stack.fixed._M_elems[9].currp >> 4) +
               (long)checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .replacep != 0);
    }
    pp_Var8 = requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_buckets;
    if (checker.activeOriginals._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      puStack_500 = (undefined1 *)0x9437cc;
      __assert_fail("activeOriginals.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                    ,0x219,"void wasm::(anonymous namespace)::Checker::visitFunction(Function *)");
    }
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._0_1_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._1_7_ = 0;
    this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
               *)checker.activeOriginals._M_h._M_bucket_count;
    if (requestInfos.
        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      __s = &applier.requestInfos.
             super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
             ._M_h._M_rehash_policy._M_next_resize;
      checker.connectAdjacentBlocks = false;
      checker._297_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .replacep = (Expression **)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.fixed._M_elems[9].currp = (Expression **)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currModule._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .connectAdjacentBlocks = false;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ._217_7_ = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_buckets =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_buckets;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_bucket_count = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_before_begin;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_element_count =
           CONCAT44(requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_element_count._4_4_,
                    (undefined4)
                    requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_element_count);
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._M_max_load_factor =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._M_max_load_factor;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._4_4_ =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._4_4_;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._M_next_resize = 0;
      if (requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_buckets == (__buckets_ptr)0x1) {
        applier.requestInfos.
        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ._M_h._M_rehash_policy._M_next_resize = 0;
      }
      else {
        puStack_500 = (undefined1 *)0x9432a8;
        __s = (size_t *)
              __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (local_31,(size_type)
                                  requestInfos.
                                  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                                  ._M_h._M_buckets,(void *)0x0);
        puStack_500 = (undefined1 *)0x9432bc;
        memset(__s,0,(long)pp_Var8 << 3);
      }
      sVar9 = requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_bucket_count;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ._216_8_ = __s;
      applier._336_8_ = __s;
      if (requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count != 0) {
        puStack_500 = (undefined1 *)0x9432e2;
        applier.requestInfos.
        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ._M_h._M_bucket_count = (size_type)operator_new(0x20);
        *(undefined8 *)
         applier.requestInfos.
         super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
         ._M_h._M_bucket_count = 0;
        *(undefined8 *)
         (applier.requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count + 0x18) = *(undefined8 *)(sVar9 + 0x18);
        uVar5 = *(undefined8 *)(sVar9 + 0x10);
        *(undefined8 *)
         (applier.requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count + 8) = *(undefined8 *)(sVar9 + 8);
        *(undefined8 *)
         (applier.requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count + 0x10) = uVar5;
        *(size_type **)
         (applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          ._216_8_ +
         (*(ulong *)(applier.requestInfos.
                     super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                     ._M_h._M_bucket_count + 8) %
         (ulong)applier.requestInfos.
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ._M_h._M_buckets) * 8) =
             &applier.requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_bucket_count;
        puVar14 = (undefined8 *)
                  applier.requestInfos.
                  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                  ._M_h._M_bucket_count;
        for (puVar18 = *(undefined8 **)sVar9; puVar18 != (undefined8 *)0x0;
            puVar18 = (undefined8 *)*puVar18) {
          puStack_500 = (undefined1 *)0x943336;
          puVar11 = (undefined8 *)operator_new(0x20);
          *puVar11 = 0;
          uVar5 = puVar18[2];
          puVar11[1] = puVar18[1];
          puVar11[2] = uVar5;
          puVar11[3] = puVar18[3];
          *puVar14 = puVar11;
          if (*(long *)(applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        ._216_8_ +
                       ((ulong)puVar11[1] %
                       (ulong)applier.requestInfos.
                              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                              ._M_h._M_buckets) * 8) == 0) {
            *(undefined8 **)
             (applier.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              ._216_8_ +
             ((ulong)puVar11[1] %
             (ulong)applier.requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_buckets) * 8) = puVar14;
          }
          puVar14 = puVar11;
        }
      }
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_single_bucket =
           (__node_base_ptr)&applier.originalLocalMap._M_h._M_rehash_policy._M_next_resize;
      applier.originalLocalMap._M_h._M_buckets = (__buckets_ptr)0x1;
      applier.originalLocalMap._M_h._M_bucket_count = 0;
      applier.originalLocalMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      applier.originalLocalMap._M_h._M_element_count._0_4_ = 0x3f800000;
      applier.originalLocalMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      applier.originalLocalMap._M_h._M_rehash_policy._4_4_ = 0;
      applier.originalLocalMap._M_h._M_rehash_policy._M_next_resize = 0;
      applier.originalLocalMap._M_h._M_single_bucket._0_1_ = 1;
      pMVar2 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
               ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
               super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = SUB81(pMVar2,0);
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = (undefined7)((ulong)pMVar2 >> 8);
      if (((long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.fixed._M_elems[9].currp >> 4) +
          (long)applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep != 0) {
        applier.originalLocalMap._M_h._M_single_bucket._0_1_ = 1;
        applier.originalLocalMap._M_h._M_rehash_policy._M_next_resize = 0;
        applier.originalLocalMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        applier.originalLocalMap._M_h._M_rehash_policy._4_4_ = 0;
        applier.originalLocalMap._M_h._M_element_count._0_4_ = 0x3f800000;
        applier.originalLocalMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        applier.originalLocalMap._M_h._M_bucket_count = 0;
        applier.originalLocalMap._M_h._M_buckets = (__buckets_ptr)0x1;
        applier.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uVar7;
        applier.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar6;
        puStack_500 = &LAB_009437eb;
        __assert_fail("stack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x12d,
                      "void wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Applier, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>]"
                     );
      }
      puStack_500 = (undefined1 *)0x9433ea;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar6;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uVar7;
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                  *)&checker.connectAdjacentBlocks,
                 LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 ::scan,(Expression **)
                        requestInfos.
                        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                        ._M_h._M_single_bucket);
      if (((long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.fixed._M_elems[9].currp >> 4) +
          (long)applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep != 0) {
        do {
          if ((pointer)applier.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .stack.fixed._M_elems[9].currp ==
              applier.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .stack.flexible.
              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if (applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep == (Expression **)0x0) {
              pcVar12 = 
              "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, N = 10]"
              ;
LAB_00943775:
              puStack_500 = (undefined1 *)0x94377f;
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x7e,pcVar12);
            }
            pTVar17 = (pointer)&applier.
                                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                .
                                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                .
                                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                .stack.fixed._M_elems
                                [(long)applier.
                                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                       .
                                       super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                       .
                                       super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                       .replacep + -2].currp;
          }
          else {
            pTVar17 = applier.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          ppEVar3 = pTVar17->currp;
          if ((pointer)applier.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .stack.fixed._M_elems[9].currp ==
              applier.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .stack.flexible.
              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if (applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep == (Expression **)0x0) {
              pcVar12 = 
              "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, N = 10]"
              ;
LAB_00943756:
              puStack_500 = (undefined1 *)0x943760;
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x75,pcVar12);
            }
            applier.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .replacep = (Expression **)
                        ((long)applier.
                               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .
                               super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .
                               super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .replacep + -1);
          }
          else {
            applier.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          checker._296_8_ = ppEVar3;
          if (*ppEVar3 == (Expression *)0x0) {
            pcVar12 = 
            "void wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Applier, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>]"
            ;
LAB_009436db:
            puStack_500 = (undefined1 *)0x9436e5;
            __assert_fail("*task.currp",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x132,pcVar12);
          }
          puStack_500 = (undefined1 *)0x943494;
          (*pTVar17->func)((Applier *)&checker.connectAdjacentBlocks,ppEVar3);
        } while (((long)applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .stack.fixed._M_elems[9].currp >> 4) +
                 (long)applier.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .replacep != 0);
      }
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = 0;
      puStack_500 = (undefined1 *)0x9434cc;
      std::
      _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&applier.requestInfos.
                        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                        ._M_h._M_single_bucket);
      puVar18 = (undefined8 *)
                applier.requestInfos.
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ._M_h._M_bucket_count;
      while (puVar18 != (undefined8 *)0x0) {
        puVar14 = (undefined8 *)*puVar18;
        puStack_500 = (undefined1 *)0x9434e2;
        operator_delete(puVar18,0x20);
        puVar18 = puVar14;
      }
      __n = (code *)0x0;
      puStack_500 = (undefined1 *)0x943503;
      memset((void *)applier.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                     ._216_8_,0,
             (long)applier.requestInfos.
                   super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                   ._M_h._M_buckets << 3);
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_bucket_count = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (&applier.requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._M_next_resize !=
          (size_t *)
          applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          ._216_8_) {
        __n = (code *)((long)applier.requestInfos.
                             super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                             ._M_h._M_buckets << 3);
        puStack_500 = (undefined1 *)0x94352c;
        operator_delete((void *)applier.
                                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                ._216_8_,(ulong)__n);
      }
      this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)checker.activeOriginals._M_h._M_bucket_count;
      if (applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
        __n = (code *)((long)applier.
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .stack.flexible.
                             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)applier.
                            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            .stack.fixed._M_elems[9].currp);
        puStack_500 = (undefined1 *)0x943547;
        operator_delete(applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .stack.fixed._M_elems[9].currp,(ulong)__n);
        this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                   *)checker.activeOriginals._M_h._M_bucket_count;
      }
    }
    while (this_00 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
            *)0x0) {
      p_Var4 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 **)this_00;
      puStack_500 = (undefined1 *)0x94355e;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
      ::_M_deallocate_node(this_00,(__node_ptr)__n);
      this_00 = p_Var4;
    }
    puStack_500 = (undefined1 *)0x94357f;
    memset(checker.requestInfos,0,(long)checker.activeOriginals._M_h._M_buckets << 3);
    checker.activeOriginals._M_h._M_bucket_count = 0;
    checker.activeOriginals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((RequestInfoMap *)psVar1 != checker.requestInfos) {
      puStack_500 = (undefined1 *)0x9435a1;
      operator_delete(checker.requestInfos,(long)checker.activeOriginals._M_h._M_buckets << 3);
    }
    if (checker.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      puStack_500 = (undefined1 *)0x9435bc;
      operator_delete(checker.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)checker.
                            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)checker.
                            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
  }
  if (scanner.activeIncrementalInfo.fixed._M_elems[9]._8_8_ != 0) {
    puStack_500 = (undefined1 *)0x9435e5;
    operator_delete((void *)scanner.activeIncrementalInfo.fixed._M_elems[9]._8_8_,
                    (long)scanner.activeIncrementalInfo.flexible.
                          super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    scanner.activeIncrementalInfo.fixed._M_elems[9]._8_8_);
  }
  puStack_500 = (undefined1 *)0x9435ed;
  std::
  _Hashtable<wasm::(anonymous_namespace)::HashedExpression,_std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_std::allocator<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>_>,_std::__detail::_Select1st,_wasm::(anonymous_namespace)::HEComparer,_wasm::(anonymous_namespace)::HEHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<wasm::(anonymous_namespace)::HashedExpression,_std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_std::allocator<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>_>,_std::__detail::_Select1st,_wasm::(anonymous_namespace)::HEComparer,_wasm::(anonymous_namespace)::HEHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)&scanner.requestInfos);
  if ((RequestInfoMap *)&scanner.activeExprs._M_h._M_rehash_policy._M_next_resize !=
      scanner.requestInfos) {
    puStack_500 = (undefined1 *)0x943609;
    operator_delete(scanner.requestInfos,(long)scanner.activeExprs._M_h._M_buckets << 3);
  }
  puVar18 = (undefined8 *)
            requestInfos.
            super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            ._M_h._M_bucket_count;
  if (scanner.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    puStack_500 = (undefined1 *)0x943624;
    operator_delete(scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)scanner.
                          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .stack.fixed._M_elems[9].currp);
    puVar18 = (undefined8 *)
              requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_bucket_count;
  }
  while (puVar18 != (undefined8 *)0x0) {
    puVar14 = (undefined8 *)*puVar18;
    puStack_500 = (undefined1 *)0x94363a;
    operator_delete(puVar18,0x20);
    puVar18 = puVar14;
  }
  puStack_500 = (undefined1 *)0x943655;
  memset(local_78,0,
         (long)requestInfos.
               super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
               ._M_h._M_buckets << 3);
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_bucket_count = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if (&requestInfos.
       super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
       ._M_h._M_rehash_policy._M_next_resize != local_78) {
    puStack_500 = (undefined1 *)0x943676;
    operator_delete(local_78,(long)requestInfos.
                                   super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                                   ._M_h._M_buckets << 3);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    auto& options = getPassOptions();

    RequestInfoMap requestInfos;

    Scanner scanner(options, requestInfos);
    scanner.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // We did not find any repeated expressions at all.
      return;
    }

    Checker checker(options, requestInfos);
    checker.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // No repeated expressions remain after checking for effects.
      return;
    }

    Applier applier(requestInfos);
    applier.walkFunctionInModule(func, getModule());
  }